

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_root.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *flagvalue;
  long *flagvalue_00;
  void *flagvalue_01;
  void *flagvalue_02;
  FILE *__s;
  int flag;
  SUNContext ctx;
  double local_c8;
  sunrealtype t;
  int rtflag;
  FILE *local_b0;
  void *local_a8;
  void *arkode_mem;
  int rootsfound [2];
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long nge;
  
  arkode_mem = (void *)0x0;
  flag = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_flag(&flag,"SUNContext_Create",1);
  if (iVar2 == 0) {
    puts("\nRobertson ODE test problem (with rootfinding):");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff0000000000000,0,0);
    flagvalue = (long *)N_VNew_Serial(3,ctx);
    iVar2 = check_flag(flagvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      puVar1 = *(undefined8 **)(*flagvalue + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      puVar1[2] = 0;
      flagvalue_00 = (long *)N_VClone(flagvalue);
      iVar2 = check_flag(flagvalue_00,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        puVar1 = *(undefined8 **)(*flagvalue_00 + 0x10);
        *puVar1 = 0x3e45798ee2308c3a;
        puVar1[1] = 0x3da5fd7fe1796495;
        puVar1[2] = 0x3e45798ee2308c3a;
        flagvalue_01 = (void *)ARKStepCreate(0,0,f,flagvalue,ctx);
        arkode_mem = flagvalue_01;
        iVar2 = check_flag(flagvalue_01,"ARKStepCreate",0);
        if (iVar2 == 0) {
          flag = ARKodeSetMaxErrTestFails(flagvalue_01,0x14);
          iVar3 = 1;
          iVar2 = check_flag(&flag,"ARKodeSetMaxErrTestFails",1);
          if (iVar2 == 0) {
            flag = ARKodeSetMaxNonlinIters(flagvalue_01,8);
            iVar3 = 1;
            iVar2 = check_flag(&flag,"ARKodeSetMaxNonlinIters",1);
            if (iVar2 == 0) {
              flag = ARKodeSetNonlinConvCoef(0x3e7ad7f29abcaf48,flagvalue_01);
              iVar3 = 1;
              iVar2 = check_flag(&flag,"ARKodeSetNonlinConvCoef",1);
              if (iVar2 == 0) {
                flag = ARKodeSetMaxNumSteps(flagvalue_01,100000);
                iVar3 = 1;
                iVar2 = check_flag(&flag,"ARKodeSetMaxNumSteps",1);
                if (iVar2 == 0) {
                  iVar3 = 1;
                  flag = ARKodeSetPredictorMethod(flagvalue_01,1);
                  iVar2 = check_flag(&flag,"ARKodeSetPredictorMethod",1);
                  if (iVar2 == 0) {
                    flag = ARKodeSVtolerances(0x3f1a36e2eb1c432d,flagvalue_01,flagvalue_00);
                    iVar3 = 1;
                    iVar2 = check_flag(&flag,"ARKodeSStolerances",1);
                    if (iVar2 == 0) {
                      flag = ARKodeRootInit(flagvalue_01,2,g);
                      iVar3 = 1;
                      iVar2 = check_flag(&flag,"ARKodeRootInit",1);
                      if (iVar2 == 0) {
                        flagvalue_02 = (void *)SUNDenseMatrix(3,3,ctx);
                        iVar2 = check_flag(flagvalue_02,"SUNDenseMatrix",0);
                        if (iVar2 == 0) {
                          local_a8 = (void *)SUNLinSol_Dense(flagvalue,flagvalue_02,ctx);
                          iVar2 = check_flag(local_a8,"SUNLinSol_Dense",0);
                          if (iVar2 == 0) {
                            flag = ARKodeSetLinearSolver(flagvalue_01,local_a8,flagvalue_02);
                            iVar3 = 1;
                            iVar2 = check_flag(&flag,"ARKodeSetLinearSolver",1);
                            if (iVar2 == 0) {
                              flag = ARKodeSetJacFn(flagvalue_01,Jac);
                              iVar3 = 1;
                              iVar2 = check_flag(&flag,"ARKodeSetJacFn",1);
                              if (iVar2 == 0) {
                                __s = fopen("solution.txt","w");
                                fwrite("# t u v w\n",10,1,__s);
                                puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                local_b0 = __s;
                                fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],
                                        puVar1[2]);
                                t = 0.0;
                                puts("        t             u             v             w");
                                puts("   -----------------------------------------------------");
                                puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",0,*puVar1,puVar1[1],
                                       puVar1[2]);
                                local_c8 = 0.4;
                                iVar2 = 0xc;
                                do {
                                  flag = ARKodeEvolve(local_c8,flagvalue_01,flagvalue,&t,1);
                                  iVar3 = check_flag(&flag,"ARKodeEvolve",1);
                                  if (iVar3 != 0) break;
                                  puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                  printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",t,*puVar1,puVar1[1],
                                         puVar1[2]);
                                  puVar1 = *(undefined8 **)(*flagvalue + 0x10);
                                  fprintf(local_b0," %.16e %.16e %.16e %.16e\n",t,*puVar1,puVar1[1],
                                          puVar1[2]);
                                  if (flag == 2) {
                                    rtflag = ARKodeGetRootInfo(flagvalue_01,rootsfound);
                                    iVar3 = check_flag(&rtflag,"ARKodeGetRootInfo",1);
                                    if (iVar3 != 0) {
                                      return 1;
                                    }
                                    printf("      rootsfound[] = %3d %3d\n",
                                           (ulong)(uint)rootsfound[0],(ulong)(uint)rootsfound[1]);
                                  }
                                  if (flag < 0) {
                                    fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                                    break;
                                  }
                                  local_c8 = local_c8 * 10.0;
                                  iVar2 = iVar2 + -1;
                                } while (iVar2 != 0);
                                puts("   -----------------------------------------------------");
                                fclose(local_b0);
                                flag = ARKodeGetNumSteps(flagvalue_01,&nst);
                                check_flag(&flag,"ARKodeGetNumSteps",1);
                                flag = ARKodeGetNumStepAttempts(flagvalue_01,&nst_a);
                                check_flag(&flag,"ARKodeGetNumStepAttempts",1);
                                iVar3 = 0;
                                flag = ARKodeGetNumRhsEvals(flagvalue_01,0,&nfe);
                                check_flag(&flag,"ARKodeGetNumRhsEvals",1);
                                flag = ARKodeGetNumRhsEvals(flagvalue_01,1,&nfi);
                                check_flag(&flag,"ARKodeGetNumRhsEvals",1);
                                flag = ARKodeGetNumLinSolvSetups(flagvalue_01,&nsetups);
                                check_flag(&flag,"ARKodeGetNumLinSolvSetups",1);
                                flag = ARKodeGetNumErrTestFails(flagvalue_01,&netf);
                                check_flag(&flag,"ARKodeGetNumErrTestFails",1);
                                flag = ARKodeGetNumStepSolveFails(flagvalue_01,&ncfn);
                                check_flag(&flag,"ARKodeGetNumStepSolveFails",1);
                                flag = ARKodeGetNumNonlinSolvIters(flagvalue_01,&nni);
                                check_flag(&flag,"ARKodeGetNumNonlinSolvIters",1);
                                flag = ARKodeGetNumNonlinSolvConvFails(flagvalue_01,&nnf);
                                check_flag(&flag,"ARKodeGetNumNonlinSolvConvFails",1);
                                flag = ARKodeGetNumJacEvals(flagvalue_01,&nje);
                                check_flag(&flag,"ARKodeGetNumJacEvals",1);
                                flag = ARKodeGetNumLinRhsEvals(flagvalue_01,&nfeLS);
                                check_flag(&flag,"ARKodeGetNumLinRhsEvals",1);
                                flag = ARKodeGetNumGEvals(flagvalue_01);
                                check_flag(&flag,"ARKodeGetNumGEvals",1);
                                puts("\nFinal Solver Statistics:");
                                printf("   Internal solver steps = %li (attempted = %li)\n",nst,
                                       nst_a);
                                printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                                printf("   Total linear solver setups = %li\n",nsetups);
                                printf("   Total RHS evals for setting up the linear system = %li\n"
                                       ,nfeLS);
                                printf("   Total number of Jacobian evaluations = %li\n",nje);
                                printf("   Total number of Newton iterations = %li\n",nni);
                                printf("   Total root-function g evals = %li\n",nge);
                                printf("   Total number of nonlinear solver convergence failures = %li\n"
                                       ,nnf);
                                printf("   Total number of error test failures = %li\n",netf);
                                printf("   Total number of failed steps from solver failure = %li\n"
                                       ,ncfn);
                                N_VDestroy(flagvalue);
                                N_VDestroy(flagvalue_00);
                                ARKodeFree(&arkode_mem);
                                SUNLinSolFree(local_a8);
                                SUNMatDestroy(flagvalue_02);
                                SUNContext_Free(&ctx);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);  /* initial time */
  sunrealtype T1    = SUN_RCONST(0.4);  /* first output time */
  sunrealtype TMult = SUN_RCONST(10.0); /* output time multiplication factor */
  int Nt            = 12;               /* total number of output times */
  sunindextype NEQ  = 3;                /* number of dependent vars. */

  /* rootfinding variables */
  int rootsfound[2];
  int rtflag; /* root info flag */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector atols     = NULL; /* empty vector for absolute tolerances */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nge;

  /* set up the initial conditions */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-4);

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem (with rootfinding):\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  atols = N_VClone(y); /* Create serial vector absolute tolerances */
  if (check_flag((void*)atols, "N_VNew_Serial", 0)) { return 1; }

  /* Set absolute tolerances */
  NV_Ith_S(atols, 0) = SUN_RCONST(1.0e-8);
  NV_Ith_S(atols, 1) = SUN_RCONST(1.0e-11);
  NV_Ith_S(atols, 2) = SUN_RCONST(1.0e-8);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the initial time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSVtolerances(arkode_mem, reltol, atols); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Specify the root-finding function, having 2 equations */
  flag = ARKodeRootInit(arkode_mem, 2, g);
  if (check_flag(&flag, "ARKodeRootInit", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t = T0;
  printf("        t             u             v             w\n");
  printf("   -----------------------------------------------------\n");
  printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  tout = T1;
  iout = 0;
  while (1)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag == ARK_ROOT_RETURN)
    { /* check if a root was found */
      rtflag = ARKodeGetRootInfo(arkode_mem, rootsfound);
      if (check_flag(&rtflag, "ARKodeGetRootInfo", 1)) { return 1; }
      printf("      rootsfound[] = %3d %3d\n", rootsfound[0], rootsfound[1]);
    }
    if (flag >= 0)
    { /* successful solve: update output time */
      iout++;
      tout *= TMult;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
    if (iout == Nt) { break; /* stop after enough outputs */ }
  }
  printf("   -----------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumGEvals(arkode_mem, &nge);
  check_flag(&flag, "ARKodeGetNumGEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total root-function g evals = %li\n", nge);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(atols);       /* Free atols vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}